

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O2

void __thiscall
LibGens::Ym2612Private::T_Update_Chan_Int<5>
          (Ym2612Private *this,channel_t *CH,int32_t *bufL,int32_t *bufR,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  if (CH->_SLOT[2].Ecnt != 0x20000000 ||
      (CH->_SLOT[1].Ecnt != 0x20000000 || CH->_SLOT[3].Ecnt != 0x20000000)) {
    this->int_cnt = (this->state).Inter_Cnt;
    iVar17 = 0;
    while (iVar17 < length) {
      iVar16 = CH->_SLOT[0].TLL;
      iVar1 = CH->_SLOT[0].Fcnt;
      iVar2 = CH->_SLOT[2].Fcnt;
      iVar3 = CH->_SLOT[1].Fcnt;
      iVar4 = CH->_SLOT[3].Fcnt;
      CH->_SLOT[0].Fcnt = CH->_SLOT[0].Finc + iVar1;
      CH->_SLOT[2].Fcnt = CH->_SLOT[2].Finc + iVar2;
      CH->_SLOT[1].Fcnt = CH->_SLOT[1].Finc + iVar3;
      CH->_SLOT[3].Fcnt = CH->_SLOT[3].Finc + iVar4;
      iVar15 = CH->_SLOT[0].Ecnt;
      iVar5 = (&ENV_TAB)[iVar15 >> 0x10];
      iVar13 = CH->_SLOT[2].Ecnt;
      iVar6 = CH->_SLOT[2].TLL;
      iVar7 = (&ENV_TAB)[iVar13 >> 0x10];
      iVar8 = CH->_SLOT[1].TLL;
      iVar9 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[1].Ecnt + 2)];
      iVar10 = CH->_SLOT[3].TLL;
      iVar11 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[3].Ecnt + 2)];
      iVar15 = iVar15 + CH->_SLOT[0].Einc;
      CH->_SLOT[0].Ecnt = iVar15;
      if (CH->_SLOT[0].Ecmp <= iVar15) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[0].Ecurp * 8))(CH->_SLOT);
        iVar13 = CH->_SLOT[2].Ecnt;
      }
      iVar13 = iVar13 + CH->_SLOT[2].Einc;
      CH->_SLOT[2].Ecnt = iVar13;
      if (CH->_SLOT[2].Ecmp <= iVar13) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[2].Ecurp * 8))(CH->_SLOT + 2);
      }
      iVar15 = CH->_SLOT[1].Ecnt + CH->_SLOT[1].Einc;
      CH->_SLOT[1].Ecnt = iVar15;
      if (CH->_SLOT[1].Ecmp <= iVar15) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[1].Ecurp * 8))(CH->_SLOT + 1);
      }
      iVar15 = CH->_SLOT[3].Ecnt + CH->_SLOT[3].Einc;
      CH->_SLOT[3].Ecnt = iVar15;
      if (CH->_SLOT[3].Ecmp <= iVar15) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[3].Ecurp * 8))(CH->_SLOT + 3);
      }
      iVar15 = CH->S0_OUT[0];
      iVar13 = CH->S0_OUT[1];
      iVar12 = CH->FB;
      CH->S0_OUT[1] = iVar15;
      iVar16 = *(int *)(*(long *)(SIN_TAB +
                                 ((uint)((iVar13 + iVar15 >> ((byte)iVar12 & 0x1f)) + iVar1) >> 0xb
                                 & 0x7ff8)) + (long)(iVar16 + iVar5) * 4);
      CH->S0_OUT[0] = iVar16;
      iVar16 = *(int *)(*(long *)(SIN_TAB + ((uint)(iVar2 + iVar16) >> 0xb & 0x7ff8)) +
                       (long)(iVar6 + iVar7) * 4) +
               *(int *)(*(long *)(SIN_TAB + ((uint)(iVar4 + iVar16) >> 0xb & 0x7ff8)) +
                       (long)(iVar10 + iVar11) * 4) +
               *(int *)(*(long *)(SIN_TAB + ((uint)(iVar3 + iVar16) >> 0xb & 0x7ff8)) +
                       (long)(iVar8 + iVar9) * 4) >> 0xe;
      CH->OUTd = iVar16;
      iVar1 = LIMIT_CH_OUT;
      if ((LIMIT_CH_OUT < iVar16) ||
         (iVar1 = -LIMIT_CH_OUT, SBORROW4(iVar16,-LIMIT_CH_OUT) != iVar16 + LIMIT_CH_OUT < 0)) {
        iVar16 = iVar1;
        CH->OUTd = iVar16;
      }
      uVar14 = this->int_cnt + (this->state).Inter_Step;
      this->int_cnt = uVar14;
      if ((uVar14 >> 0xe & 1) != 0) {
        uVar14 = uVar14 & 0x3fff;
        this->int_cnt = uVar14;
        iVar16 = (int)(uVar14 * CH->Old_OUTd + iVar16 * (uVar14 ^ 0x3fff)) >> 0xe;
        CH->Old_OUTd = iVar16;
        bufL[iVar17] = bufL[iVar17] + ((iVar16 * CH->PANVolumeL) / 0xffff & CH->LEFT);
        bufR[iVar17] = bufR[iVar17] + ((CH->PANVolumeR * CH->Old_OUTd) / 0xffff & CH->RIGHT);
        iVar17 = iVar17 + 1;
        iVar16 = CH->OUTd;
      }
      CH->Old_OUTd = iVar16;
    }
  }
  return;
}

Assistant:

inline void Ym2612Private::T_Update_Chan_Int(channel_t *CH, int32_t *bufL, int32_t *bufR, int length)
{
	// Check if the channel has reached the end of the update.
	{
		int not_end = (CH->_SLOT[S3].Ecnt - ENV_END);

		// Special cases.
		// Copied from Game_Music_Emu v0.5.2.
		if (algo == 7)
			not_end |= (CH->_SLOT[S0].Ecnt - ENV_END);
		if (algo >= 5)
			not_end |= (CH->_SLOT[S2].Ecnt - ENV_END);
		if (algo >= 4)
			not_end |= (CH->_SLOT[S1].Ecnt - ENV_END);

		if (not_end == 0)
			return;
	}

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"Algo %d Int len = %d", algo, length);

	int_cnt = state.Inter_Cnt;

	for (int i = 0; i < length; i++) {
		int in0, in1, in2, in3;		// current phase calculation
		int en0, en1, en2, en3;		// current envelope calculation

		GET_CURRENT_PHASE();
		UPDATE_PHASE();
		GET_CURRENT_ENV();
		UPDATE_ENV();

		assert(algo >= 0 && algo <= 7);
		switch (algo) {
			case 0:
				DO_ALGO_0();
				break;
			case 1:
				DO_ALGO_1();
				break;
			case 2:
				DO_ALGO_2();
				break;
			case 3:
				DO_ALGO_3();
				break;
			case 4:
				DO_ALGO_4();
				break;
			case 5:
				DO_ALGO_5();
				break;
			case 6:
				DO_ALGO_6();
				break;
			case 7:
				DO_ALGO_7();
				break;
			default:
				break;
		}

		DO_OUTPUT_INT();
	}
}